

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcProjectOrderRecord::IfcProjectOrderRecord(IfcProjectOrderRecord *this)

{
  IfcProjectOrderRecord *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x128,"IfcProjectOrderRecord");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__010df450);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrderRecord,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrderRecord,_2UL>,
             &PTR_construction_vtable_24__010df500);
  *(undefined8 *)this = 0x10df370;
  *(undefined8 *)&this->field_0x128 = 0x10df438;
  *(undefined8 *)&this->field_0x88 = 0x10df398;
  *(undefined8 *)&this->field_0x98 = 0x10df3c0;
  *(undefined8 *)&this->field_0xd0 = 0x10df3e8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrderRecord,_2UL>)._vptr_ObjectHelper
       = (_func_int **)0x10df410;
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrderRecord,_2UL>).
              field_0x10);
  std::__cxx11::string::string((string *)&this->PredefinedType);
  return;
}

Assistant:

IfcProjectOrderRecord() : Object("IfcProjectOrderRecord") {}